

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void dumpAlign(DumpState *D,uint align)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = (uint)D->offset & 3;
  if ((uVar1 != 0) && (D->status == 0)) {
    uVar3 = (ulong)(4 - uVar1);
    iVar2 = (*D->writer)(D->L,&dumpAlign::paddingContent,uVar3,D->data);
    D->status = iVar2;
    D->offset = D->offset + uVar3;
  }
  return;
}

Assistant:

static void dumpAlign (DumpState *D, unsigned align) {
  unsigned padding = align - cast_uint(D->offset % align);
  if (padding < align) {  /* padding == align means no padding */
    static lua_Integer paddingContent = 0;
    lua_assert(align <= sizeof(lua_Integer));
    dumpBlock(D, &paddingContent, padding);
  }
  lua_assert(D->offset % align == 0);
}